

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_setop.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundSetOperationNode *node)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  shared_ptr<duckdb::Binder,_true> *this_01;
  bool bVar1;
  undefined8 uVar2;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var3;
  _Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
  _Var4;
  __uniq_ptr_impl<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>_> _Var5;
  Binder *pBVar6;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var7;
  reference pvVar8;
  pointer pEVar9;
  pointer pLVar10;
  pointer pBVar11;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var12;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  undefined1 uVar13;
  BoundQueryNode *node_00;
  idx_t i;
  ulong __n;
  undefined1 local_d8 [16];
  LogicalOperatorType logical_type;
  undefined7 uStack_c7;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_c0;
  pointer local_b8;
  __node_base local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
  local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [8];
  vector<duckdb::LogicalType,_true> left_types;
  vector<duckdb::LogicalType,_true> right_types;
  
  bVar1 = *(bool *)((long)&node[2].super_BoundQueryNode.names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1);
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0xf);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  pBVar6->is_outside_flattened = bVar1;
  bVar1 = *(bool *)((long)&node[2].super_BoundQueryNode.names.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1);
  this_01 = (shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x11);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  pBVar6->is_outside_flattened = bVar1;
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0xc));
  CreatePlan((Binder *)(local_d8 + 8),(BoundQueryNode *)pBVar6);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0xd));
  CreatePlan((Binder *)local_d8,(BoundQueryNode *)pBVar6);
  _Var12._M_head_impl =
       in_RDX[0x13].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var7._M_head_impl =
       in_RDX[0x14].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (_Var12._M_head_impl == _Var7._M_head_impl) {
    pBVar11 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(in_RDX + 0xc));
    local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)&left_types,(vector<duckdb::LogicalType,_true> *)node,&pBVar11->types,
               in_RDX + 8);
    uVar2 = local_d8._8_8_;
    local_d8._8_8_ =
         left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar2)[1])();
    }
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*local_a8->_vptr__Sp_counted_base[1])();
    }
    local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pBVar11 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(in_RDX + 0xd));
    local_b0._M_nxt = (_Hash_node_base *)local_d8._0_8_;
    local_d8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)&left_types,(vector<duckdb::LogicalType,_true> *)node,&pBVar11->types,
               in_RDX + 8);
    uVar2 = local_d8._0_8_;
    local_d8._0_8_ =
         left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start;
    if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
        uVar2 != (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )0x0) {
      (**(code **)(*(long *)uVar2 + 8))();
    }
    if ((element_type *)local_b0._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_b0._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_b0._M_nxt = (_Hash_node_base *)0x0;
  }
  else {
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (__n = 0; __n < (ulong)((long)_Var7._M_head_impl - (long)_Var12._M_head_impl >> 3);
        __n = __n + 1) {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)(in_RDX + 0x13),__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ,&pEVar9->return_type);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)(in_RDX + 0x16),__n);
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&right_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pEVar9->return_type);
      _Var12._M_head_impl =
           in_RDX[0x13].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var7._M_head_impl =
           in_RDX[0x14].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    }
    local_c0._M_head_impl = (LogicalProjection *)GenerateTableIndex((Binder *)node);
    make_uniq<duckdb::LogicalProjection,unsigned_long,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((duckdb *)&logical_type,(unsigned_long *)&local_c0,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(in_RDX + 0x13));
    pLVar10 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&logical_type);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar10->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)(local_d8 + 8));
    _Var3._M_head_impl = _logical_type;
    uVar2 = local_d8._8_8_;
    _logical_type = (LogicalProjection *)0x0;
    local_d8._8_8_ = _Var3._M_head_impl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar2)[1])();
    }
    local_90 = (undefined1  [8])GenerateTableIndex((Binder *)node);
    make_uniq<duckdb::LogicalProjection,unsigned_long,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
              ((duckdb *)&local_c0,(unsigned_long *)local_90,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)(in_RDX + 0x16));
    pLVar10 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_c0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar10->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_d8);
    _Var3._M_head_impl = local_c0._M_head_impl;
    uVar2 = local_d8._0_8_;
    local_c0._M_head_impl = (LogicalProjection *)0x0;
    local_d8._0_8_ = _Var3._M_head_impl;
    if ((LogicalOperator *)uVar2 != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)uVar2 + 8))();
    }
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_90,(vector<duckdb::LogicalType,_true> *)node,&left_types,in_RDX + 8);
    uVar2 = local_d8._8_8_;
    local_d8._8_8_ = local_90;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(*(_func_int ***)uVar2)[1])();
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*local_98->_vptr__Sp_counted_base[1])();
    }
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_d8._0_8_;
    local_d8._0_8_ = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    CastLogicalOperatorToTypes
              ((Binder *)local_90,(vector<duckdb::LogicalType,_true> *)node,&right_types,in_RDX + 8)
    ;
    uVar2 = local_d8._0_8_;
    local_d8._0_8_ = local_90;
    if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
        uVar2 != (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )0x0) {
      (**(code **)(*(long *)uVar2 + 8))();
    }
    if (local_a0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   local_a0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_a0.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)(LogicalOperator *)0x0;
    if (local_c0._M_head_impl != (LogicalProjection *)0x0) {
      (*(code *)((__node_base_ptr)
                ((local_c0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)[1]._M_nxt)()
      ;
    }
    if ((ClientContext *)_logical_type != (ClientContext *)0x0) {
      (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                   &(_logical_type->super_LogicalOperator)._vptr_LogicalOperator)->internal).
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
    ;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  }
  uVar13 = 1;
  if ((*(char *)&node[2].super_BoundQueryNode.names.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish == '\0') &&
     (pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00),
     pBVar6->has_unplanned_dependent_joins == false)) {
    pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
    uVar13 = pBVar6->has_unplanned_dependent_joins;
  }
  _Var4.super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalProjection_*,_false>)
       (_Head_base<0UL,_duckdb::LogicalProjection_*,_false>)_logical_type;
  *(undefined1 *)
   &node[2].super_BoundQueryNode.names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = uVar13;
  _logical_type = _logical_type & 0xffffffffffffff00;
  _Var5._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
  .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
       (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
       _logical_type;
  uStack_c7 = _Var4.super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl._1_7_;
  switch(*(undefined1 *)
          &in_RDX[0xb].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
  case 1:
  case 4:
    logical_type = 0x4b;
    _Var5._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         _logical_type;
    break;
  case 2:
    logical_type = 0x4c;
    _Var5._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         _logical_type;
    break;
  case 3:
    logical_type = 0x4d;
    _Var5._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
    .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         (tuple<duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>)
         _logical_type;
  }
  _logical_type =
       (LogicalProjection *)
       _Var5._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalProjection_*,_std::default_delete<duckdb::LogicalProjection>_>
       .super__Head_base<0UL,_duckdb::LogicalProjection_*,_false>._M_head_impl;
  node_00 = (BoundQueryNode *)(in_RDX + 0xe);
  right_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)in_RDX[9].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                 (long)in_RDX[8].
                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) / 0x18
                );
  make_uniq<duckdb::LogicalSetOperation,unsigned_long&,unsigned_long,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::LogicalOperatorType&,bool&>
            ((duckdb *)&left_types,(unsigned_long *)node_00,(unsigned_long *)&right_types,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)(local_d8 + 8),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)local_d8,&logical_type,
             (bool *)((long)&in_RDX[0xb].
                             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
                     1));
  local_b8 = left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  VisitQueryNode(this,node_00,in_RDX);
  if (local_b8 != (pointer)0x0) {
    (**(code **)(*(long *)local_b8 + 8))();
  }
  local_b8 = (pointer)0x0;
  if (left_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)(*(long *)left_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  if ((LogicalOperator *)local_d8._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_d8._0_8_ + 8))();
  }
  if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_d8._8_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundSetOperationNode &node) {
	// Generate the logical plan for the left and right sides of the set operation
	node.left_binder->is_outside_flattened = is_outside_flattened;
	node.right_binder->is_outside_flattened = is_outside_flattened;

	auto left_node = node.left_binder->CreatePlan(*node.left);
	auto right_node = node.right_binder->CreatePlan(*node.right);

	// Add a new projection to child node
	D_ASSERT(node.left_reorder_exprs.size() == node.right_reorder_exprs.size());
	if (!node.left_reorder_exprs.empty()) {
		D_ASSERT(node.setop_type == SetOperationType::UNION_BY_NAME);
		vector<LogicalType> left_types;
		vector<LogicalType> right_types;
		// We are going to add a new projection operator, so collect the type
		// of reorder exprs in order to call CastLogicalOperatorToTypes()
		for (idx_t i = 0; i < node.left_reorder_exprs.size(); ++i) {
			left_types.push_back(node.left_reorder_exprs[i]->return_type);
			right_types.push_back(node.right_reorder_exprs[i]->return_type);
		}

		auto left_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.left_reorder_exprs));
		left_projection->children.push_back(std::move(left_node));
		left_node = std::move(left_projection);

		auto right_projection = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(node.right_reorder_exprs));
		right_projection->children.push_back(std::move(right_node));
		right_node = std::move(right_projection);

		left_node = CastLogicalOperatorToTypes(left_types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(right_types, node.types, std::move(right_node));
	} else {
		left_node = CastLogicalOperatorToTypes(node.left->types, node.types, std::move(left_node));
		right_node = CastLogicalOperatorToTypes(node.right->types, node.types, std::move(right_node));
	}

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.left_binder->has_unplanned_dependent_joins ||
	                                node.right_binder->has_unplanned_dependent_joins;

	// create actual logical ops for setops
	LogicalOperatorType logical_type = LogicalOperatorType::LOGICAL_INVALID;
	switch (node.setop_type) {
	case SetOperationType::UNION:
	case SetOperationType::UNION_BY_NAME:
		logical_type = LogicalOperatorType::LOGICAL_UNION;
		break;
	case SetOperationType::EXCEPT:
		logical_type = LogicalOperatorType::LOGICAL_EXCEPT;
		break;
	case SetOperationType::INTERSECT:
		logical_type = LogicalOperatorType::LOGICAL_INTERSECT;
		break;
	default:
		D_ASSERT(false);
		break;
	}

	auto root = make_uniq<LogicalSetOperation>(node.setop_index, node.types.size(), std::move(left_node),
	                                           std::move(right_node), logical_type, node.setop_all);

	return VisitQueryNode(node, std::move(root));
}